

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

xmlChar * xmlTextReaderLookupNamespace(xmlTextReaderPtr reader,xmlChar *prefix)

{
  int iVar1;
  xmlNsPtr pxStack_28;
  int result;
  xmlNsPtr ns;
  xmlChar *prefix_local;
  xmlTextReaderPtr reader_local;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    reader_local = (xmlTextReaderPtr)0x0;
  }
  else if (reader->node == (xmlNodePtr)0x0) {
    reader_local = (xmlTextReaderPtr)0x0;
  }
  else {
    ns = (xmlNsPtr)prefix;
    prefix_local = (xmlChar *)reader;
    iVar1 = xmlSearchNsSafe(reader->node,prefix,&stack0xffffffffffffffd8);
    if (iVar1 < 0) {
      xmlTextReaderErrMemory((xmlTextReaderPtr)prefix_local);
      reader_local = (xmlTextReaderPtr)0x0;
    }
    else if (pxStack_28 == (xmlNsPtr)0x0) {
      reader_local = (xmlTextReaderPtr)0x0;
    }
    else {
      reader_local = (xmlTextReaderPtr)readerStrdup((xmlTextReaderPtr)prefix_local,pxStack_28->href)
      ;
    }
  }
  return (xmlChar *)reader_local;
}

Assistant:

xmlChar *
xmlTextReaderLookupNamespace(xmlTextReaderPtr reader, const xmlChar *prefix) {
    xmlNsPtr ns;
    int result;

    if (reader == NULL)
	return(NULL);
    if (reader->node == NULL)
	return(NULL);

    result = xmlSearchNsSafe(reader->node, prefix, &ns);
    if (result < 0) {
        xmlTextReaderErrMemory(reader);
        return(NULL);
    }
    if (ns == NULL)
	return(NULL);
    return(readerStrdup(reader, ns->href));
}